

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

void slang::ast::addBlockMembers(GenerateBlockSymbol *block,SyntaxNode *syntax)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  long lVar3;
  
  if (syntax->kind == GenerateBlock) {
    pSVar1 = syntax[6].previewNode;
    if (pSVar1 != (SyntaxNode *)0x0) {
      pSVar2 = syntax[6].parent;
      lVar3 = 0;
      do {
        Scope::addMembers(&block->super_Scope,*(SyntaxNode **)((long)&pSVar2->kind + lVar3));
        lVar3 = lVar3 + 8;
      } while ((long)pSVar1 << 3 != lVar3);
    }
    return;
  }
  Scope::addMembers(&block->super_Scope,syntax);
  return;
}

Assistant:

static void addBlockMembers(GenerateBlockSymbol& block, const SyntaxNode& syntax) {
    if (syntax.kind != SyntaxKind::GenerateBlock) {
        block.addMembers(syntax);
    }
    else {
        for (auto member : syntax.as<GenerateBlockSyntax>().members)
            block.addMembers(*member);
    }
}